

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O0

bool icu_63::double_conversion::ConsumeSubString<char_const*>
               (char **current,char *end,char *substring)

{
  char *local_28;
  char *substring_local;
  char *end_local;
  char **current_local;
  
  local_28 = substring + 1;
  while( true ) {
    if (*local_28 == '\0') {
      *current = *current + 1;
      return true;
    }
    *current = *current + 1;
    if ((*current == end) || (**current != *local_28)) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

static bool ConsumeSubString(Iterator* current,
                             Iterator end,
                             const char* substring) {
  ASSERT(**current == *substring);
  for (substring++; *substring != '\0'; substring++) {
    ++*current;
    if (*current == end || **current != *substring) return false;
  }
  ++*current;
  return true;
}